

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  char cVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  istream *is;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  code *pcVar10;
  iterator iVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  undefined8 uVar13;
  pointer elems;
  char escape;
  ulong uVar14;
  _Rb_tree_color _Var15;
  byte *pbVar16;
  pointer pmVar17;
  ulong uVar18;
  pointer pbVar19;
  bool bVar20;
  byte *pbVar21;
  string namebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  string linebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  index_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  stringstream errss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  allocator local_489;
  pointer local_488;
  pointer local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string *local_450;
  pointer local_448;
  iterator iStack_440;
  index_t *local_438;
  size_type *local_428;
  size_type local_420;
  size_type local_418;
  undefined8 uStack_410;
  undefined1 local_408 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3e8;
  ios_base *local_3c8;
  MaterialReader *local_3c0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_3b8;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> local_398;
  pointer local_380;
  istream *local_378;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [7];
  ios_base local_2f0 [264];
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Base_ptr local_1c8;
  size_t local_1c0;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  local_450 = err;
  local_3c0 = readMatFn;
  local_378 = inStream;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1d8._8_8_ = local_1e8 + 8;
  local_1e8._8_4_ = _S_red;
  local_1d8._M_allocated_capacity = 0;
  local_1c0 = 0;
  local_438 = (index_t *)0x0;
  local_448 = (pointer)0x0;
  iStack_440._M_current = (index_t *)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8 = (_Base_ptr)local_1d8._8_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_3e8,2);
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  elems = (pointer)0x0;
  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408._0_8_ = local_408 + 0x10;
  local_408._8_8_ = 0;
  local_408[0x10] = '\0';
  local_3c8 = local_2f0;
LAB_0015284b:
  do {
    while( true ) {
      do {
        do {
          is = local_378;
          iVar5 = std::istream::peek();
          if (iVar5 == -1) {
            if (local_450 != (string *)0x0) {
              std::__cxx11::stringbuf::str();
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(local_450,(char *)local_370._0_8_,local_370._8_8_);
              if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                operator_delete((void *)local_370._0_8_);
              }
            }
            if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
              operator_delete((void *)local_408._0_8_);
            }
            if ((pointer)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_3b8.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_3e8);
            std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                      (&local_398);
            if (local_448 != (pointer)0x0) {
              operator_delete(local_448);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1e8);
            std::__cxx11::stringstream::~stringstream(local_1b8);
            std::ios_base::~ios_base(local_138);
            return true;
          }
          safeGetline(is,(string *)local_408);
          uVar13 = local_408._0_8_;
          if ((local_408._8_8_ != 0) &&
             (elems = (pointer)local_408._0_8_,
             ((pointer)(local_408._0_8_ + -1))[local_408._8_8_] == '\n')) {
            local_408._8_8_ = local_408._8_8_ - 1;
            *(char *)(local_408._0_8_ + local_408._8_8_) = '\0';
          }
          if ((local_408._8_8_ != 0) &&
             (elems = (pointer)local_408._0_8_,
             ((pointer)(local_408._0_8_ + -1))[local_408._8_8_] == '\r')) {
            local_408._8_8_ = local_408._8_8_ - 1;
            *(char *)(local_408._0_8_ + local_408._8_8_) = '\0';
          }
        } while (local_408._8_8_ == 0);
        sVar8 = strspn((char *)local_408._0_8_," \t");
        cVar1 = *(char *)(uVar13 + sVar8);
      } while ((cVar1 == '\0') || (cVar1 == '#'));
      pbVar16 = (byte *)(uVar13 + sVar8);
      if ((cVar1 != 'v') || ((pbVar16[1] != 0x20 && (pbVar16[1] != 9)))) break;
      sVar8 = strspn((char *)(pbVar16 + 2)," \t");
      pbVar16 = pbVar16 + sVar8 + 2;
      sVar8 = strcspn((char *)pbVar16," \t\r");
      pbVar21 = pbVar16 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar16,(char *)pbVar21,(double *)local_370);
      local_480 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar21," \t");
      pbVar21 = pbVar21 + sVar8;
      sVar8 = strcspn((char *)pbVar21," \t\r");
      pbVar16 = pbVar21 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar21,(char *)pbVar16,(double *)local_370);
      local_488 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar16," \t");
      pbVar16 = pbVar16 + sVar8;
      sVar8 = strcspn((char *)pbVar16," \t\r");
      pbVar21 = pbVar16 + sVar8;
      local_370._0_8_ = (pointer)0x0;
      tryParseDouble((char *)pbVar16,(char *)pbVar21,(double *)local_370);
      local_380 = (pointer)local_370._0_8_;
      sVar8 = strspn((char *)pbVar21," \t");
      pbVar21 = pbVar21 + sVar8;
      sVar8 = strcspn((char *)pbVar21," \t\r");
      local_370._0_8_ = (char *)0x3ff0000000000000;
      tryParseDouble((char *)pbVar21,(char *)(pbVar21 + sVar8),(double *)local_370);
      if (*(code **)callback != (code *)0x0) {
        (**(code **)callback)
                  ((float)(double)local_480,(float)(double)local_488,(float)(double)local_380,
                   (float)(double)local_370._0_8_,user_data);
      }
    }
    if (cVar1 == 'v') {
      if ((pbVar16[1] == 0x6e) && ((pbVar16[2] == 0x20 || (pbVar16[2] == 9)))) {
        sVar8 = strspn((char *)(pbVar16 + 3)," \t");
        pbVar16 = pbVar16 + sVar8 + 3;
        sVar8 = strcspn((char *)pbVar16," \t\r");
        pbVar21 = pbVar16 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar16,(char *)pbVar21,(double *)local_370);
        local_480 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar8;
        sVar8 = strcspn((char *)pbVar21," \t\r");
        pbVar16 = pbVar21 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar16,(double *)local_370);
        local_488 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar16," \t");
        pbVar16 = pbVar16 + sVar8;
        sVar8 = strcspn((char *)pbVar16," \t\r");
        local_370._0_8_ = (char *)0x0;
        tryParseDouble((char *)pbVar16,(char *)(pbVar16 + sVar8),(double *)local_370);
        if (*(code **)(callback + 8) != (code *)0x0) {
          (**(code **)(callback + 8))
                    ((float)(double)local_480,(float)(double)local_488,
                     (float)(double)local_370._0_8_,user_data);
        }
        goto LAB_0015284b;
      }
      if ((pbVar16[1] == 0x74) && ((pbVar16[2] == 0x20 || (pbVar16[2] == 9)))) {
        sVar8 = strspn((char *)(pbVar16 + 3)," \t");
        pbVar16 = pbVar16 + sVar8 + 3;
        sVar8 = strcspn((char *)pbVar16," \t\r");
        pbVar21 = pbVar16 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar16,(char *)pbVar21,(double *)local_370);
        local_480 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar21," \t");
        pbVar21 = pbVar21 + sVar8;
        sVar8 = strcspn((char *)pbVar21," \t\r");
        pbVar16 = pbVar21 + sVar8;
        local_370._0_8_ = (pointer)0x0;
        tryParseDouble((char *)pbVar21,(char *)pbVar16,(double *)local_370);
        local_488 = (pointer)local_370._0_8_;
        sVar8 = strspn((char *)pbVar16," \t");
        pbVar16 = pbVar16 + sVar8;
        sVar8 = strcspn((char *)pbVar16," \t\r");
        local_370._0_8_ = (char *)0x0;
        tryParseDouble((char *)pbVar16,(char *)(pbVar16 + sVar8),(double *)local_370);
        if (*(code **)(callback + 0x10) != (code *)0x0) {
          (**(code **)(callback + 0x10))
                    ((float)(double)local_480,(float)(double)local_488,
                     (float)(double)local_370._0_8_,user_data);
        }
        goto LAB_0015284b;
      }
    }
    if ((cVar1 == 'f') && ((pbVar16[1] == 0x20 || (pbVar16[1] == 9)))) {
      sVar8 = strspn((char *)(pbVar16 + 2)," \t");
      if ((pointer)iStack_440._M_current != local_448) {
        iStack_440._M_current = (index_t *)local_448;
      }
      pbVar16 = pbVar16 + sVar8 + 2;
      while ((0xd < *pbVar16 || (elems = (pointer)0x2401, (0x2401U >> (*pbVar16 & 0x1f) & 1) == 0)))
      {
        iVar6 = atoi((char *)pbVar16);
        sVar8 = strcspn((char *)pbVar16,"/ \t\r");
        pbVar21 = pbVar16 + sVar8;
        iVar5 = 0;
        if (pbVar16[sVar8] == 0x2f) {
          if (pbVar21[1] == 0x2f) {
            pbVar21 = pbVar21 + 2;
            iVar7 = 0;
          }
          else {
            pbVar16 = pbVar21 + 1;
            iVar7 = atoi((char *)pbVar16);
            sVar8 = strcspn((char *)pbVar16,"/ \t\r");
            pbVar21 = pbVar16 + sVar8;
            if (pbVar16[sVar8] != 0x2f) goto LAB_00152dea;
            pbVar21 = pbVar21 + 1;
          }
          iVar5 = atoi((char *)pbVar21);
          sVar8 = strcspn((char *)pbVar21,"/ \t\r");
          pbVar21 = pbVar21 + sVar8;
        }
        else {
          iVar7 = 0;
          iVar5 = 0;
        }
LAB_00152dea:
        local_370._4_4_ = iVar5;
        local_370._0_4_ = iVar6;
        local_370._8_4_ = iVar7;
        if (iStack_440._M_current == local_438) {
          std::vector<tinyobj::index_t,std::allocator<tinyobj::index_t>>::
          _M_realloc_insert<tinyobj::index_t_const&>
                    ((vector<tinyobj::index_t,std::allocator<tinyobj::index_t>> *)&local_448,
                     iStack_440,(index_t *)local_370);
        }
        else {
          (iStack_440._M_current)->texcoord_index = iVar7;
          (iStack_440._M_current)->vertex_index = iVar6;
          (iStack_440._M_current)->normal_index = iVar5;
          iStack_440._M_current = iStack_440._M_current + 1;
        }
        sVar8 = strspn((char *)pbVar21," \t\r");
        pbVar16 = pbVar21 + sVar8;
      }
      pcVar10 = *(code **)(callback + 0x18);
      if ((pcVar10 != (code *)0x0) && ((long)iStack_440._M_current - (long)local_448 != 0)) {
        uVar14 = ((long)iStack_440._M_current - (long)local_448 >> 2) * -0x5555555555555555;
        elems = (pointer)0xaaaaaaaaaaaaaaab;
        pmVar17 = local_448;
LAB_001530cc:
        (*pcVar10)(user_data,pmVar17,uVar14);
      }
    }
    else {
      iVar5 = strncmp((char *)pbVar16,"usemtl",6);
      if ((iVar5 == 0) && ((pbVar16[6] == 0x20 || (pbVar16[6] == 9)))) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_370);
        sVar8 = strlen((char *)(pbVar16 + 7));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_370 + 0x10),(char *)(pbVar16 + 7),sVar8);
        std::__cxx11::stringbuf::str();
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)local_1e8,&local_4b0);
        elems = (pointer)(local_1e8 + 8);
        if ((pointer)iVar11._M_node == elems) {
          _Var15 = ~_S_red;
          if ((warn != (string *)0x0) && (*(long *)(callback + 0x20) == 0)) {
            std::operator+(&local_478,"material [ ",&local_4b0);
            pbVar12 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&local_478," ] not found in .mtl\n");
            local_428 = (size_type *)(pbVar12->_M_dataplus)._M_p;
            elems = (pointer)&pbVar12->field_2;
            if ((pointer)local_428 == elems) {
              local_418 = *(size_type *)elems;
              uStack_410 = *(undefined8 *)((long)&pbVar12->field_2 + 8);
              local_428 = &local_418;
            }
            else {
              local_418 = *(size_type *)elems;
            }
            local_420 = pbVar12->_M_string_length;
            (pbVar12->_M_dataplus)._M_p = (pointer)elems;
            pbVar12->_M_string_length = 0;
            (pbVar12->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(warn,(char *)local_428,local_420);
            if (local_428 != &local_418) {
              operator_delete(local_428);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_478._M_dataplus._M_p != &local_478.field_2) {
              operator_delete(local_478._M_dataplus._M_p);
            }
          }
        }
        else {
          _Var15 = iVar11._M_node[2]._M_color;
        }
        if (*(code **)(callback + 0x20) != (code *)0x0) {
          (**(code **)(callback + 0x20))(user_data,local_4b0._M_dataplus._M_p,_Var15);
        }
LAB_00153492:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
          operator_delete(local_4b0._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_370);
        std::ios_base::~ios_base(local_3c8);
      }
      else {
        iVar5 = strncmp((char *)pbVar16,"mtllib",6);
        pbVar4 = local_3e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_3e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((iVar5 == 0) && ((pbVar16[6] == 0x20 || (pbVar16[6] == 9)))) {
          if (local_3c0 != (MaterialReader *)0x0) {
            local_478._M_dataplus._M_p = (pointer)0x0;
            local_478._M_string_length = 0;
            local_478.field_2._M_allocated_capacity = 0;
            std::__cxx11::string::string
                      ((string *)local_370,(char *)(pbVar16 + 7),(allocator *)&local_4b0);
            SplitString((string *)local_370,(char)&local_478,escape,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)elems);
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_);
            }
            if (local_478._M_dataplus._M_p == (pointer)local_478._M_string_length) {
              if (warn != (string *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(warn,"Looks like empty filename for mtllib. Use default material. \n");
              }
            }
            else {
              if ((pointer)local_478._M_string_length != local_478._M_dataplus._M_p) {
                lVar9 = 0;
                pmVar17 = (pointer)0x0;
                bVar20 = false;
                do {
                  local_370._0_8_ = local_370 + 0x10;
                  local_370._8_8_ = 0;
                  local_360[0]._M_local_buf[0] = '\0';
                  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
                  local_4b0._M_string_length = 0;
                  local_4b0.field_2._M_local_buf[0] = '\0';
                  std::__cxx11::string::string
                            ((string *)&local_428,*(char **)(local_478._M_dataplus._M_p + lVar9),
                             &local_489);
                  elems = (pointer)local_1e8;
                  iVar5 = (*local_3c0->_vptr_MaterialReader[2])
                                    (local_3c0,(string *)&local_428,&local_398,elems,local_370,
                                     &local_4b0);
                  if (local_428 != &local_418) {
                    operator_delete(local_428);
                  }
                  if ((warn != (string *)0x0) && (local_370._8_8_ != 0)) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(warn,(char *)local_370._0_8_,local_370._8_8_);
                  }
                  if ((local_450 !=
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
                     (local_4b0._M_string_length != 0)) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_append(local_450,local_4b0._M_dataplus._M_p,local_4b0._M_string_length);
                  }
                  if ((char)iVar5 != '\0') {
                    bVar20 = true;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
                    operator_delete(local_4b0._M_dataplus._M_p);
                  }
                  if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
                    operator_delete((void *)local_370._0_8_);
                  }
                  if ((char)iVar5 != '\0') break;
                  pmVar17 = (pointer)((long)&(pmVar17->name)._M_dataplus._M_p + 1);
                  elems = (pointer)((long)(local_478._M_string_length -
                                          (long)local_478._M_dataplus._M_p) >> 5);
                  lVar9 = lVar9 + 0x20;
                } while (pmVar17 < elems);
                if (bVar20) {
                  if (*(code **)(callback + 0x28) != (code *)0x0) {
                    if (local_398.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_398.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
LAB_00153697:
                      uVar13 = std::__throw_out_of_range_fmt
                                         ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          ,0);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_478);
                      if ((_Base_ptr)local_408._0_8_ != (_Base_ptr)(local_408 + 0x10)) {
                        operator_delete((void *)local_408._0_8_);
                      }
                      if ((pointer)local_3b8.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_3b8.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_3e8);
                      std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
                      ~vector(&local_398);
                      if (local_448 != (pointer)0x0) {
                        operator_delete(local_448);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)local_1e8);
                      std::__cxx11::stringstream::~stringstream(local_1b8);
                      std::ios_base::~ios_base(local_138);
                      _Unwind_Resume(uVar13);
                    }
                    elems = local_398.
                            super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                    (**(code **)(callback + 0x28))
                              (user_data,
                               local_398.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               ((long)local_398.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_398.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x63fb9aeb1fdcd759);
                  }
                  goto LAB_001534fb;
                }
              }
              if (warn != (string *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(warn,"Failed to load material file(s). Use default material.\n");
              }
            }
LAB_001534fb:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_478);
          }
        }
        else if (cVar1 == 'o') {
          if ((pbVar16[1] == 0x20) || (pbVar16[1] == 9)) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_370);
            sVar8 = strlen((char *)(pbVar16 + 2));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_370 + 0x10),(char *)(pbVar16 + 2),sVar8);
            std::__cxx11::stringbuf::str();
            if (*(code **)(callback + 0x38) != (code *)0x0) {
              (**(code **)(callback + 0x38))(user_data,local_4b0._M_dataplus._M_p);
            }
            goto LAB_00153492;
          }
        }
        else if ((cVar1 == 'g') && ((pbVar16[1] == 0x20 || (pbVar16[1] == 9)))) {
          pbVar19 = local_3e8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_3e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_3e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              pcVar2 = (pbVar19->_M_dataplus)._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2 != &pbVar19->field_2) {
                operator_delete(pcVar2);
              }
              pbVar19 = pbVar19 + 1;
            } while (pbVar19 != pbVar4);
            local_3e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          }
          while( true ) {
            if ((*pbVar16 < 0xe) &&
               (elems = (pointer)0x2401, (0x2401U >> (*pbVar16 & 0x1f) & 1) != 0)) break;
            local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
            local_4b0._M_string_length = 0;
            local_4b0.field_2._M_local_buf[0] = '\0';
            sVar8 = strspn((char *)pbVar16," \t");
            pbVar16 = pbVar16 + sVar8;
            sVar8 = strcspn((char *)pbVar16," \t\r");
            pbVar21 = pbVar16 + sVar8;
            local_370._0_8_ = local_370 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_370,pbVar16,pbVar21);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_4b0,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370
                     );
            if ((undefined1 *)local_370._0_8_ != local_370 + 0x10) {
              operator_delete((void *)local_370._0_8_);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_3e8,&local_4b0);
            sVar8 = strspn((char *)pbVar21," \t\r");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
              operator_delete(local_4b0._M_dataplus._M_p);
            }
            pbVar16 = pbVar21 + sVar8;
          }
          if (*(code **)(callback + 0x30) != (code *)0x0) {
            uVar14 = (long)local_3e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_3e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (1 < uVar14) {
              std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
                        (&local_3b8,uVar14 - 1);
              if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar14 = 0;
              }
              else {
                lVar9 = 0x20;
                uVar18 = 0;
                do {
                  *(undefined8 *)
                   ((real_t *)
                    ((long)local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x20) + uVar18 * 2 + -8) =
                       *(undefined8 *)
                        ((long)&((local_3e8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar9);
                  uVar18 = uVar18 + 1;
                  uVar14 = (long)local_3b8.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_3b8.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3;
                  lVar9 = lVar9 + 0x20;
                } while (uVar18 < uVar14);
              }
              if (local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_3b8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,uVar14);
                goto LAB_00153697;
              }
              pcVar10 = *(code **)(callback + 0x30);
              elems = (pointer)local_3b8.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
              pmVar17 = (pointer)local_3b8.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
              goto LAB_001530cc;
            }
            (**(code **)(callback + 0x30))(user_data,0,0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', '\\', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}